

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O3

ssl_open_record_t __thiscall
bssl::dtls_open_record
          (bssl *this,SSL *ssl,uint8_t *out_type,DTLSRecordNumber *out_number,
          Span<unsigned_char> *out,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  byte bVar1;
  ushort *puVar2;
  Span<const_unsigned_char> header;
  Span<unsigned_char> in_00;
  char cVar3;
  bool bVar4;
  uint16_t uVar5;
  ushort uVar6;
  uint16_t uVar7;
  int iVar8;
  ssl_open_record_t sVar9;
  long lVar10;
  uint64_t uVar11;
  pointer __s;
  byte bVar12;
  ushort uVar13;
  ushort uVar14;
  ulong uVar15;
  size_t sVar16;
  ushort uVar17;
  uint8_t *puVar18;
  size_t *psVar19;
  SSLAEADContext *this_00;
  uint8_t *puVar20;
  Span<const_unsigned_char> in_01;
  OPENSSL_timeval OVar21;
  CBS seq_bytes;
  CBS cbs;
  ParsedDTLSRecord record;
  byte local_e2 [2];
  SSLAEADContext *local_e0;
  size_t *local_d8;
  size_t *local_d0;
  CBS local_c8;
  CBS local_b8;
  size_t *local_a8;
  uint8_t *puStack_a0;
  CBS local_98;
  CBS local_88;
  byte local_78 [2];
  uint16_t local_76 [3];
  uint8_t *local_70;
  CBS local_68;
  uchar *local_50;
  size_t sStack_48;
  uchar *local_40;
  uchar *puStack_38;
  
  out->data_ = (uchar *)0x0;
  if (*(int *)(*(long *)(this + 0x30) + 0xac) == 1) {
    return ssl_open_record_close_notify;
  }
  if (in.data_ == (uchar *)0x0) {
    return ssl_open_record_partial;
  }
  local_b8.data = out_alert;
  local_b8.len = (size_t)in.data_;
  local_78[0] = 0;
  local_76[0] = 0;
  local_a8 = (size_t *)0x0;
  puStack_a0 = (uint8_t *)0x0;
  local_68.data = out_alert;
  local_68.len = (size_t)in.data_;
  local_d0 = out_consumed;
  iVar8 = CBS_get_u8(&local_b8,local_78);
  if (iVar8 == 0) goto LAB_00171ce7;
  if ((local_78[0] & 0xe0) == 0x20) {
    if ((local_78[0] & 0x10) != 0) goto LAB_00171ce7;
    uVar6 = *(ushort *)(*(long *)(this + 0x38) + 8);
    puVar2 = *(ushort **)(*(long *)(this + 0x38) + 0x90);
    if ((puVar2 != (ushort *)0x0) && (uVar14 = *puVar2, uVar6 <= uVar14)) {
      uVar6 = uVar14;
    }
    uVar17 = uVar6 & 0xfffc;
    uVar14 = uVar17 + (local_78[0] & 3);
    uVar13 = (uVar17 - 4) + (local_78[0] & 3);
    if (uVar14 <= uVar6) {
      uVar13 = uVar14;
    }
    if (uVar17 == 0) {
      uVar13 = uVar14;
    }
    local_e0 = (SSLAEADContext *)(2 - (ulong)((local_78[0] & 8) == 0));
    iVar8 = CBS_get_bytes(&local_b8,&local_c8,(size_t)local_e0);
    if (iVar8 == 0) goto LAB_00171ce7;
    if ((local_78[0] & 4) == 0) {
      iVar8 = CBS_get_bytes(&local_b8,&local_88,local_b8.len);
      if (iVar8 == 0) goto LAB_00171f67;
    }
    else {
      iVar8 = CBS_get_u16_length_prefixed(&local_b8,&local_88);
      if (iVar8 == 0) goto LAB_00171ce7;
    }
    lVar10 = *(long *)(this + 0x38);
    if (*(long *)(lVar10 + 0x98) != 0) {
      OVar21 = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
      lVar10 = *(long *)(this + 0x38);
      if (*(ulong *)(*(long *)(lVar10 + 0x98) + 0x88) < OVar21.tv_sec) {
        std::__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                   (lVar10 + 0x98),(pointer)0x0);
        lVar10 = *(long *)(this + 0x38);
      }
    }
    if (*(ushort *)(lVar10 + 8) == uVar13) {
      psVar19 = (size_t *)(lVar10 + 8);
    }
    else {
      psVar19 = *(size_t **)(lVar10 + 0x90);
      if (((psVar19 == (size_t *)0x0) || ((ushort)*psVar19 != uVar13)) &&
         ((psVar19 = *(size_t **)(lVar10 + 0x98), psVar19 == (size_t *)0x0 ||
          ((ushort)*psVar19 != uVar13)))) goto LAB_00171b06;
    }
    if (((*(short *)(*(long *)(this + 0x30) + 0xd0) != 0) &&
        (local_d8 = psVar19, uVar5 = ssl_protocol_version((SSL *)this), uVar13 != 0)) &&
       (0x303 < uVar5)) {
      local_a8 = local_d8;
      cVar3 = (**(code **)(*(long *)local_d8[2] + 0x20))
                        ((long *)local_d8[2],local_e2,2,local_88.data,local_88.len);
      if (cVar3 == '\0') goto LAB_00171ce7;
      if (local_c8.len == 0) {
        uVar6 = 0;
      }
      else {
        sVar16 = 0;
        uVar6 = 0;
        do {
          bVar12 = local_c8.data[sVar16];
          bVar1 = local_e2[sVar16];
          local_c8.data[sVar16] = bVar12 ^ bVar1;
          uVar6 = (ushort)(bVar12 ^ bVar1) | uVar6 << 8;
          sVar16 = sVar16 + 1;
        } while (local_c8.len != sVar16);
      }
      out_consumed = local_d8;
      uVar11 = reconstruct_seqnum(uVar6,(ulong)(uint)~(-1 << ((byte)((int)local_e0 << 3) & 0x1f)),
                                  local_d8[7]);
      puStack_a0 = (uint8_t *)((ulong)uVar13 << 0x30 | uVar11);
    }
  }
  else {
    iVar8 = CBS_get_u16(&local_b8,local_76);
    if (((iVar8 == 0) || (iVar8 = CBS_get_u64(&local_b8,(uint64_t *)&local_c8), iVar8 == 0)) ||
       (iVar8 = CBS_get_u16_length_prefixed(&local_b8,&local_88), puVar20 = local_c8.data,
       iVar8 == 0)) goto LAB_00171ce7;
    puStack_a0 = local_c8.data;
    if (local_c8.data < (uint8_t *)0x1000000000000) {
      if ((local_76[0] & 0xff00) != 0xfe00) goto LAB_00171ce7;
    }
    else {
      if (*(short *)(*(long *)(this + 0x30) + 0xd0) == 0) {
        uVar6 = 0xfeff;
        uVar14 = local_76[0];
      }
      else {
        local_e0 = (SSLAEADContext *)CONCAT44(local_e0._4_4_,(uint)local_76[0]);
        uVar5 = ssl_protocol_version((SSL *)this);
        uVar6 = 0xfefd;
        uVar14 = (ushort)local_e0;
        if (uVar5 < 0x304) {
          uVar6 = *(ushort *)(*(long *)(this + 0x30) + 0xd0);
        }
      }
      if (uVar14 != uVar6) goto LAB_00171ce7;
    }
    lVar10 = *(long *)(this + 0x38);
    if (*(short *)(lVar10 + 8) == (short)((ulong)puVar20 >> 0x30)) {
      if (*(short *)(*(long *)(this + 0x30) + 0xd0) != 0) {
        uVar5 = ssl_protocol_version((SSL *)this);
        if (((uint8_t *)0xffffffffffff < puVar20) && (0x303 < uVar5)) goto LAB_00171b06;
        lVar10 = *(long *)(this + 0x38);
      }
      local_a8 = (size_t *)(lVar10 + 8);
    }
  }
LAB_00171b06:
  if (local_88.len < 0x4141) {
    iVar8 = CBS_get_bytes(&local_68,&local_98,(long)local_88.data - (long)local_68.data);
    if (iVar8 == 0) {
LAB_00171f67:
      abort();
    }
    in_01.size_ = (size_t)out_consumed;
    in_01.data_ = (uchar *)local_98.len;
    ssl_do_msg_callback(this,(SSL *)0x0,0x100,(int)local_98.data,in_01);
    uVar5 = local_76[0];
    puVar20 = puStack_a0;
    if (local_a8 != (size_t *)0x0) {
      puVar18 = (uint8_t *)((ulong)puStack_a0 & 0xffffffffffff);
      uVar15 = (long)local_a8[7] - (long)puVar18;
      if (((uint8_t *)local_a8[7] < puVar18) ||
         ((uVar15 < 0x100 && ((local_a8[(uVar15 >> 6) + 3] >> (uVar15 & 0x3f) & 1) == 0)))) {
        this_00 = (SSLAEADContext *)local_a8[1];
        bVar12 = local_78[0];
        if (*(short *)(*(long *)(this + 0x30) + 0xd0) != 0) {
          local_d8 = (size_t *)CONCAT71(local_d8._1_7_,local_78[0]);
          local_e0 = (SSLAEADContext *)local_a8[1];
          local_70 = puVar18;
          uVar7 = ssl_protocol_version((SSL *)this);
          this_00 = local_e0;
          bVar12 = (byte)local_d8;
          if (0x303 < uVar7) {
            puVar20 = local_70;
          }
        }
        local_40 = local_98.data;
        puStack_38 = (uchar *)local_98.len;
        local_50 = local_88.data;
        sStack_48 = local_88.len;
        header.size_ = local_98.len;
        header.data_ = local_98.data;
        in_00.size_ = local_88.len;
        in_00.data_ = local_88.data;
        bVar4 = SSLAEADContext::Open
                          (this_00,(Span<unsigned_char> *)out_number,bVar12,uVar5,(uint64_t)puVar20,
                           header,in_00);
        if (bVar4) {
          out->data_ = in.data_ + -local_b8.len;
          if (*(long *)local_a8[1] == 0) {
            if (0x4000 < out_number[1].combined_) goto LAB_00171d0c;
          }
          else {
            uVar5 = ssl_protocol_version((SSL *)this);
            uVar15 = out_number[1].combined_;
            if (0x4001 - (ulong)(uVar5 < 0x304) < uVar15) {
LAB_00171d0c:
              ERR_put_error(0x10,0,0x88,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                            ,0x15d);
              *(undefined1 *)local_d0 = 0x16;
              return ssl_open_record_error;
            }
            if (0x303 < uVar5) {
              do {
                uVar15 = uVar15 - 1;
                if (uVar15 == 0xffffffffffffffff) {
                  ERR_put_error(0x10,0,0x8b,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                                ,0x165);
                  *(undefined1 *)local_d0 = 0x33;
                  return ssl_open_record_error;
                }
                local_78[0] = *(byte *)(out_number->combined_ + uVar15);
                out_number[1].combined_ = uVar15;
              } while (local_78[0] == 0);
            }
          }
          DTLSReplayBitmap::Record
                    ((DTLSReplayBitmap *)(local_a8 + 3),(ulong)puStack_a0 & 0xffffffffffff);
          if (local_a8 == *(size_t **)(*(long *)(this + 0x38) + 0x90)) {
            uVar5 = ssl_protocol_version((SSL *)this);
            if (uVar5 < 0x304) {
              __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                            ,0x175,
                            "enum ssl_open_record_t bssl::dtls_open_record(SSL *, uint8_t *, DTLSRecordNumber *, Span<uint8_t> *, size_t *, uint8_t *, Span<uint8_t>)"
                           );
            }
            __s = (pointer)OPENSSL_malloc(0x90);
            if (__s == (pointer)0x0) {
              local_c8.data = (uint8_t *)0x0;
              *(undefined1 *)local_d0 = 0x50;
              std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)&local_c8);
              return ssl_open_record_error;
            }
            memset(__s,0,0x90);
            local_c8.data = (uint8_t *)__s;
            OVar21 = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
            uVar11 = 0xffffffffffffffff;
            if (OVar21.tv_sec < 0xffffffffffffff0f) {
              uVar11 = OVar21.tv_sec + 0xf0;
            }
            *(uint64_t *)((long)local_c8.data + 0x88) = uVar11;
            DTLSReadEpoch::operator=
                      ((DTLSReadEpoch *)local_c8.data,(DTLSReadEpoch *)(*(long *)(this + 0x38) + 8))
            ;
            puVar20 = local_c8.data;
            local_c8.data = (uint8_t *)0x0;
            std::__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                       (*(long *)(this + 0x38) + 0x98),(pointer)puVar20);
            DTLSReadEpoch::operator=
                      ((DTLSReadEpoch *)(*(long *)(this + 0x38) + 8),
                       *(DTLSReadEpoch **)(*(long *)(this + 0x38) + 0x90));
            std::__uniq_ptr_impl<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::reset
                      ((__uniq_ptr_impl<bssl::DTLSReadEpoch,_bssl::internal::Deleter> *)
                       (*(long *)(this + 0x38) + 0x90),(pointer)0x0);
            std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)&local_c8);
          }
          if (local_78[0] == 0x15) {
            sVar9 = ssl_process_alert((SSL *)this,(uint8_t *)local_d0,
                                      *(Span<const_unsigned_char> *)out_number);
            return sVar9;
          }
          if (local_78[0] == 0x17) {
            if ((*(short *)(*(long *)(this + 0x30) + 0xd0) == 0) ||
               (uVar5 = ssl_protocol_version((SSL *)this), uVar5 < 0x304)) {
              if ((uint8_t *)0xffffffffffff < puStack_a0) goto LAB_00171efe;
            }
            else if ((2 < (ushort)((ulong)puStack_a0 >> 0x30)) ||
                    (((ulong)puStack_a0 & 0xffff000000000000) == 0x1000000000000))
            goto LAB_00171efe;
            ERR_put_error(0x10,0,0xe1,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                          ,0x19e);
            *(undefined1 *)local_d0 = 10;
            return ssl_open_record_error;
          }
LAB_00171efe:
          *(undefined1 *)(*(long *)(this + 0x30) + 0xd5) = 0;
          *(byte *)&ssl->method = local_78[0];
          *(uint8_t **)out_type = puStack_a0;
          return ssl_open_record_success;
        }
        ERR_clear_error();
      }
    }
    in.data_ = in.data_ + -local_b8.len;
  }
LAB_00171ce7:
  out->data_ = in.data_;
  return ssl_open_record_discard;
}

Assistant:

enum ssl_open_record_t dtls_open_record(SSL *ssl, uint8_t *out_type,
                                        DTLSRecordNumber *out_number,
                                        Span<uint8_t> *out,
                                        size_t *out_consumed,
                                        uint8_t *out_alert, Span<uint8_t> in) {
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }

  if (in.empty()) {
    return ssl_open_record_partial;
  }

  CBS cbs(in);
  ParsedDTLSRecord record;
  if (!parse_dtls_record(ssl, &cbs, &record)) {
    // The record header was incomplete or malformed. Drop the entire packet.
    *out_consumed = in.size();
    return ssl_open_record_discard;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HEADER, record.header);

  if (record.read_epoch == nullptr ||
      record.read_epoch->bitmap.ShouldDiscard(record.number.sequence())) {
    // Drop this record. It's from an unknown epoch or is a replay. Note that if
    // the record is from next epoch, it could be buffered for later. For
    // simplicity, drop it and expect retransmit to handle it later; DTLS must
    // handle packet loss anyway.
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }

  // Decrypt the body in-place.
  if (!record.read_epoch->aead->Open(out, record.type, record.version,
                                     dtls_aead_sequence(ssl, record.number),
                                     record.header,
                                     cbs_to_writable_bytes(record.body))) {
    // Bad packets are silently dropped in DTLS. See section 4.2.1 of RFC 6347.
    // Clear the error queue of any errors decryption may have added. Drop the
    // entire packet as it must not have come from the peer.
    //
    // TODO(davidben): This doesn't distinguish malloc failures from encryption
    // failures.
    ERR_clear_error();
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }
  *out_consumed = in.size() - CBS_len(&cbs);

  // DTLS 1.3 hides the record type inside the encrypted data.
  bool has_padding = !record.read_epoch->aead->is_null_cipher() &&
                     ssl_protocol_version(ssl) >= TLS1_3_VERSION;
  // Check the plaintext length.
  size_t plaintext_limit = SSL3_RT_MAX_PLAIN_LENGTH + (has_padding ? 1 : 0);
  if (out->size() > plaintext_limit) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  if (has_padding) {
    do {
      if (out->empty()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
        *out_alert = SSL_AD_DECRYPT_ERROR;
        return ssl_open_record_error;
      }
      record.type = out->back();
      *out = out->subspan(0, out->size() - 1);
    } while (record.type == 0);
  }

  record.read_epoch->bitmap.Record(record.number.sequence());

  // Once we receive a record from the next epoch in DTLS 1.3, it becomes the
  // current epoch. Also save the previous epoch. This allows us to handle
  // packet reordering on KeyUpdate, as well as ACK retransmissions of the
  // Finished flight.
  if (record.read_epoch == ssl->d1->next_read_epoch.get()) {
    assert(ssl_protocol_version(ssl) >= TLS1_3_VERSION);
    auto prev = MakeUnique<DTLSPrevReadEpoch>();
    if (prev == nullptr) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return ssl_open_record_error;
    }

    // Release the epoch after a timeout.
    prev->expire = ssl_ctx_get_current_time(ssl->ctx.get()).tv_sec;
    if (prev->expire >= UINT64_MAX - DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS) {
      prev->expire = UINT64_MAX;  // Saturate on overflow.
    } else {
      prev->expire += DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS;
    }

    prev->epoch = std::move(ssl->d1->read_epoch);
    ssl->d1->prev_read_epoch = std::move(prev);
    ssl->d1->read_epoch = std::move(*ssl->d1->next_read_epoch);
    ssl->d1->next_read_epoch = nullptr;
  }

  // TODO(davidben): Limit the number of empty records as in TLS? This is only
  // useful if we also limit discarded packets.

  if (record.type == SSL3_RT_ALERT) {
    return ssl_process_alert(ssl, out_alert, *out);
  }

  // Reject application data in epochs that do not allow it.
  if (record.type == SSL3_RT_APPLICATION_DATA) {
    bool app_data_allowed;
    if (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // Application data is allowed in 0-RTT (epoch 1) and after the handshake
      // (3 and up).
      app_data_allowed =
          record.number.epoch() == 1 || record.number.epoch() >= 3;
    } else {
      // Application data is allowed starting epoch 1.
      app_data_allowed = record.number.epoch() >= 1;
    }
    if (!app_data_allowed) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
  }

  ssl->s3->warning_alert_count = 0;

  *out_type = record.type;
  *out_number = record.number;
  return ssl_open_record_success;
}